

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int test_dependOnContext(void)

{
  int iVar1;
  char *__s2;
  undefined8 uVar2;
  T11 local_a8 [6];
  T11 local_78 [4];
  undefined1 local_58 [8];
  Context ctx;
  
  di::Context::Context((Context *)local_58);
  di::Context::get<T11>((Context *)local_58);
  T11::run_abi_cxx11_(local_78);
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp("A",__s2);
  std::__cxx11::string::~string((string *)local_78);
  if (iVar1 != 0) {
    di::Context::get<T11>((Context *)local_58);
    T11::run_abi_cxx11_(local_a8);
    uVar2 = std::__cxx11::string::c_str();
    printf("%s:%d expected \"%s\", actual: \"%s\"\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/hoditohod[P]di-light/test.cpp",
           0x170,"A",uVar2);
    std::__cxx11::string::~string((string *)local_a8);
    printf("%s","");
  }
  ctx.constructionOrder.
  super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  ctx.constructionOrder.
  super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = iVar1 == 0;
  di::Context::~Context((Context *)local_58);
  return ctx.constructionOrder.
         super__Vector_base<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int test_dependOnContext()
{
    di::Context ctx;
    TINYTEST_STR_EQUAL( "A", ctx.get<T11>().run().c_str() );
    return 1;
}